

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::MockAsyncInputStream::tryRead
          (MockAsyncInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  ulong in_R8;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar1;
  Promise<unsigned_long> PVar2;
  size_t local_30;
  _func_int **local_28;
  uchar *puStack_20;
  
  if (*(ulong *)((long)buffer + 0x18) < in_R8) {
    in_R8 = *(ulong *)((long)buffer + 0x18);
  }
  if (in_R8 <= maxBytes) {
    in_R8 = maxBytes;
  }
  if (*(ulong *)((long)buffer + 0x10) <= in_R8) {
    in_R8 = *(ulong *)((long)buffer + 0x10);
  }
  memcpy((void *)minBytes,*(void **)((long)buffer + 8),in_R8);
  *(long *)((long)buffer + 8) = *(long *)((long)buffer + 8) + in_R8;
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) - in_R8;
  local_30 = in_R8;
  OVar1 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>((kj *)&local_28,&local_30);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = local_28;
  (this->bytes).ptr = puStack_20;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    // Clamp max read to blockSize.
    size_t n = kj::min(blockSize, maxBytes);

    // Unless that's less than minBytes -- in which case, use minBytes.
    n = kj::max(n, minBytes);

    // But also don't read more data than we have.
    n = kj::min(n, bytes.size());

    memcpy(buffer, bytes.begin(), n);
    bytes = bytes.slice(n, bytes.size());
    return n;
  }